

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.cc
# Opt level: O0

int Bits::FindLSBSetNonZero_Portable(uint32 n)

{
  int iVar1;
  undefined4 local_18;
  uint32 x;
  int shift;
  int i;
  int rc;
  uint32 n_local;
  
  shift = 0x1f;
  local_18 = 0x10;
  i = n;
  for (x = 4; -1 < (int)x; x = x - 1) {
    iVar1 = i << (sbyte)local_18;
    if (iVar1 != 0) {
      shift = shift - local_18;
      i = iVar1;
    }
    local_18 = local_18 >> 1;
  }
  return shift;
}

Assistant:

int Bits::FindLSBSetNonZero_Portable(uint32 n) {
  int rc = 31;
  for (int i = 4, shift = 1 << 4; i >= 0; --i) {
    const uint32 x = n << shift;
    if (x != 0) {
      n = x;
      rc -= shift;
    }
    shift >>= 1;
  }
  return rc;
}